

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccp_pass.cpp
# Opt level: O3

void __thiscall spvtools::opt::CCPPass::Initialize(CCPPass *this)

{
  IRContext *this_00;
  Instruction *pIVar1;
  byte bVar2;
  int32_t iVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  IRContext *pIVar6;
  mapped_type *pmVar7;
  Module *pMVar8;
  Instruction *inst;
  Instruction *this_01;
  uint32_t local_40;
  uint32_t local_3c;
  CCPPass *local_38;
  
  this_00 = (this->super_MemPass).super_Pass.context_;
  pIVar6 = this_00;
  if ((this_00->valid_analyses_ & kAnalysisConstants) == kAnalysisNone) {
    IRContext::BuildConstantManager(this_00);
    pIVar6 = (this->super_MemPass).super_Pass.context_;
  }
  this->const_mgr_ =
       (this_00->constant_mgr_)._M_t.
       super___uniq_ptr_impl<spvtools::opt::analysis::ConstantManager,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
       ._M_t.
       super__Tuple_impl<0UL,_spvtools::opt::analysis::ConstantManager_*,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
       .super__Head_base<0UL,_spvtools::opt::analysis::ConstantManager_*,_false>._M_head_impl;
  pMVar8 = (pIVar6->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  pIVar1 = (Instruction *)
           ((long)&(pMVar8->types_values_).super_IntrusiveList<spvtools::opt::Instruction> + 8);
  this_01 = *(Instruction **)
             ((long)&(pMVar8->types_values_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10)
  ;
  if (this_01 != pIVar1) {
    local_38 = this;
    do {
      iVar3 = spvOpcodeIsConstant(this_01->opcode_);
      if (iVar3 == 0) {
LAB_001cbe42:
        uVar4 = 0;
        if (this_01->has_result_id_ == true) {
          uVar4 = Instruction::GetSingleWordOperand(this_01,(uint)this_01->has_type_id_);
        }
        local_40 = uVar4;
        pmVar7 = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&this->values_,&local_40);
        *pmVar7 = 0xffffffff;
      }
      else {
        iVar3 = spvOpcodeIsSpecConstant(this_01->opcode_);
        if (iVar3 != 0) goto LAB_001cbe42;
        bVar2 = this_01->has_result_id_;
        uVar4 = 0;
        if ((bool)bVar2 == true) {
          uVar4 = Instruction::GetSingleWordOperand(this_01,(uint)this_01->has_type_id_);
          bVar2 = this_01->has_result_id_;
        }
        uVar5 = 0;
        if ((bVar2 & 1) != 0) {
          uVar5 = Instruction::GetSingleWordOperand(this_01,(uint)this_01->has_type_id_);
        }
        local_3c = uVar5;
        pmVar7 = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&this->values_,&local_3c);
        *pmVar7 = uVar4;
      }
      this_01 = (this_01->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (this_01 != pIVar1);
    pMVar8 = (((local_38->super_MemPass).super_Pass.context_)->module_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
             .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
    this = local_38;
  }
  this->original_id_bound_ = (pMVar8->header_).bound;
  return;
}

Assistant:

void CCPPass::Initialize() {
  const_mgr_ = context()->get_constant_mgr();

  // Populate the constant table with values from constant declarations in the
  // module.  The values of each OpConstant declaration is the identity
  // assignment (i.e., each constant is its own value).
  for (const auto& inst : get_module()->types_values()) {
    // Record compile time constant ids. Treat all other global values as
    // varying.
    if (inst.IsConstant()) {
      values_[inst.result_id()] = inst.result_id();
    } else {
      values_[inst.result_id()] = kVaryingSSAId;
    }
  }

  original_id_bound_ = context()->module()->IdBound();
}